

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

int Sbd_CutMergeSimple(Sbd_Man_t *p,int *pCut1,int *pCut2,int *pCut)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  
  piVar8 = pCut1 + 1;
  piVar7 = pCut2 + 1;
  iVar4 = *pCut1;
  iVar1 = *pCut2;
  piVar6 = pCut;
  do {
    uVar5 = (4 - (long)pCut) + (long)piVar6;
    while( true ) {
      piVar6 = piVar6 + 1;
      if ((pCut1 + (long)iVar4 + 1 <= piVar8) || (pCut2 + (long)iVar1 + 1 <= piVar7)) {
        for (; piVar8 < pCut1 + (long)iVar4 + 1; piVar8 = piVar8 + 1) {
          *piVar6 = *piVar8;
          piVar6 = piVar6 + 1;
          uVar5 = uVar5 + 4;
        }
        for (lVar9 = 0; (int *)((long)piVar7 + lVar9) < pCut2 + (long)iVar1 + 1; lVar9 = lVar9 + 4)
        {
          *(int *)((long)piVar6 + lVar9) = *(int *)((long)piVar7 + lVar9);
          uVar5 = uVar5 + 4;
        }
        iVar4 = (int)(uVar5 >> 2) + -1;
        *pCut = iVar4;
        return iVar4;
      }
      iVar2 = *piVar8;
      iVar3 = *piVar7;
      if (iVar2 == iVar3) {
        piVar8 = piVar8 + 1;
        *piVar6 = iVar2;
        goto LAB_00455dbe;
      }
      if (iVar3 <= iVar2) break;
      piVar8 = piVar8 + 1;
      *piVar6 = iVar2;
      uVar5 = uVar5 + 4;
    }
    *piVar6 = iVar3;
LAB_00455dbe:
    piVar7 = piVar7 + 1;
  } while( true );
}

Assistant:

int Sbd_CutMergeSimple( Sbd_Man_t * p, int * pCut1, int * pCut2, int * pCut )
{
    int * pBeg  = pCut + 1;
    int * pBeg1 = pCut1 + 1;
    int * pBeg2 = pCut2 + 1;
    int * pEnd1 = pCut1 + 1 + pCut1[0];
    int * pEnd2 = pCut2 + 1 + pCut2[0];
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    return (pCut[0] = pBeg - pCut - 1);
}